

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O2

png_fixed_point png_fixed_inches_from_microns(png_const_structrp png_ptr,png_int_32 microns)

{
  int iVar1;
  png_fixed_point result;
  
  iVar1 = png_muldiv(&result,microns,500,0x7f);
  if (iVar1 == 0) {
    png_warning(png_ptr,"fixed point overflow ignored");
    result = 0;
  }
  return result;
}

Assistant:

static png_fixed_point
png_fixed_inches_from_microns(png_const_structrp png_ptr, png_int_32 microns)
{
   /* Convert from meters * 1,000,000 to inches * 100,000, meters to
    * inches is simply *(100/2.54), so we want *(10/2.54) == 500/127.
    * Notice that this can overflow - a warning is output and 0 is
    * returned.
    */
   png_fixed_point result;

   if (png_muldiv(&result, microns, 500, 127) != 0)
      return result;

   png_warning(png_ptr, "fixed point overflow ignored");
   return 0;
}